

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void av1_read_sequence_header(AV1_COMMON *cm,aom_read_bit_buffer *rb,SequenceHeader *seq_params)

{
  long lVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint8_t uVar7;
  
  iVar3 = aom_rb_read_literal(rb,4);
  iVar4 = aom_rb_read_literal(rb,4);
  iVar5 = aom_rb_read_literal(rb,iVar3 + 1);
  iVar6 = aom_rb_read_literal(rb,iVar4 + 1);
  seq_params->num_bits_width = iVar3 + 1;
  seq_params->num_bits_height = iVar4 + 1;
  seq_params->max_frame_width = iVar5 + 1;
  seq_params->max_frame_height = iVar6 + 1;
  if (seq_params->reduced_still_picture_hdr == '\0') {
    iVar3 = aom_rb_read_bit(rb);
    uVar2 = (uint8_t)iVar3;
  }
  else {
    uVar2 = '\0';
  }
  seq_params->frame_id_numbers_present_flag = uVar2;
  if (uVar2 != '\0') {
    iVar3 = aom_rb_read_literal(rb,4);
    seq_params->delta_frame_id_length = iVar3 + 2;
    iVar3 = aom_rb_read_literal(rb,3);
    seq_params->frame_id_length = iVar3 + seq_params->delta_frame_id_length + 1;
    if (0xf < seq_params->delta_frame_id_length + iVar3) {
      aom_internal_error(cm->error,AOM_CODEC_CORRUPT_FRAME,"Invalid frame_id_length");
    }
  }
  iVar3 = aom_rb_read_bit(rb);
  seq_params->sb_size = (iVar3 != 0) * '\x03' + BLOCK_64X64;
  lVar1 = (ulong)(iVar3 != 0) * 3;
  seq_params->mib_size =
       (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [lVar1 + 0xc];
  seq_params->mib_size_log2 = (uint)""[lVar1 + 0xc];
  iVar3 = aom_rb_read_bit(rb);
  seq_params->enable_filter_intra = (uint8_t)iVar3;
  iVar3 = aom_rb_read_bit(rb);
  seq_params->enable_intra_edge_filter = (uint8_t)iVar3;
  if (seq_params->reduced_still_picture_hdr == '\0') {
    iVar3 = aom_rb_read_bit(rb);
    seq_params->enable_interintra_compound = (uint8_t)iVar3;
    iVar3 = aom_rb_read_bit(rb);
    seq_params->enable_masked_compound = (uint8_t)iVar3;
    iVar3 = aom_rb_read_bit(rb);
    seq_params->enable_warped_motion = (uint8_t)iVar3;
    iVar3 = aom_rb_read_bit(rb);
    seq_params->enable_dual_filter = (uint8_t)iVar3;
    iVar3 = aom_rb_read_bit(rb);
    (seq_params->order_hint_info).enable_order_hint = iVar3;
    iVar5 = 0;
    iVar4 = 0;
    if (iVar3 != 0) {
      iVar4 = aom_rb_read_bit(rb);
    }
    (seq_params->order_hint_info).enable_dist_wtd_comp = iVar4;
    if ((seq_params->order_hint_info).enable_order_hint != 0) {
      iVar5 = aom_rb_read_bit(rb);
    }
    (seq_params->order_hint_info).enable_ref_frame_mvs = iVar5;
    iVar3 = aom_rb_read_bit(rb);
    uVar7 = '\x02';
    uVar2 = '\x02';
    if (iVar3 == 0) {
      iVar3 = aom_rb_read_bit(rb);
      uVar2 = (uint8_t)iVar3;
    }
    seq_params->force_screen_content_tools = uVar2;
    if (uVar2 != '\0') {
      iVar3 = aom_rb_read_bit(rb);
      if (iVar3 == 0) {
        iVar3 = aom_rb_read_bit(rb);
        uVar7 = (uint8_t)iVar3;
      }
    }
    seq_params->force_integer_mv = uVar7;
    if ((seq_params->order_hint_info).enable_order_hint != 0) {
      iVar3 = aom_rb_read_literal(rb,3);
      goto LAB_001646d7;
    }
  }
  else {
    (seq_params->order_hint_info).enable_order_hint = 0;
    (seq_params->order_hint_info).enable_dist_wtd_comp = 0;
    (seq_params->order_hint_info).enable_ref_frame_mvs = 0;
    seq_params->enable_interintra_compound = '\0';
    seq_params->enable_masked_compound = '\0';
    seq_params->enable_dual_filter = '\0';
    seq_params->enable_warped_motion = '\0';
    seq_params->force_screen_content_tools = '\x02';
    seq_params->force_integer_mv = '\x02';
  }
  iVar3 = -1;
LAB_001646d7:
  (seq_params->order_hint_info).order_hint_bits_minus_1 = iVar3;
  iVar3 = aom_rb_read_bit(rb);
  seq_params->enable_superres = (uint8_t)iVar3;
  iVar3 = aom_rb_read_bit(rb);
  seq_params->enable_cdef = (uint8_t)iVar3;
  iVar3 = aom_rb_read_bit(rb);
  seq_params->enable_restoration = (uint8_t)iVar3;
  return;
}

Assistant:

void av1_read_sequence_header(AV1_COMMON *cm, struct aom_read_bit_buffer *rb,
                              SequenceHeader *seq_params) {
  const int num_bits_width = aom_rb_read_literal(rb, 4) + 1;
  const int num_bits_height = aom_rb_read_literal(rb, 4) + 1;
  const int max_frame_width = aom_rb_read_literal(rb, num_bits_width) + 1;
  const int max_frame_height = aom_rb_read_literal(rb, num_bits_height) + 1;

  seq_params->num_bits_width = num_bits_width;
  seq_params->num_bits_height = num_bits_height;
  seq_params->max_frame_width = max_frame_width;
  seq_params->max_frame_height = max_frame_height;

  if (seq_params->reduced_still_picture_hdr) {
    seq_params->frame_id_numbers_present_flag = 0;
  } else {
    seq_params->frame_id_numbers_present_flag = aom_rb_read_bit(rb);
  }
  if (seq_params->frame_id_numbers_present_flag) {
    // We must always have delta_frame_id_length < frame_id_length,
    // in order for a frame to be referenced with a unique delta.
    // Avoid wasting bits by using a coding that enforces this restriction.
    seq_params->delta_frame_id_length = aom_rb_read_literal(rb, 4) + 2;
    seq_params->frame_id_length =
        aom_rb_read_literal(rb, 3) + seq_params->delta_frame_id_length + 1;
    if (seq_params->frame_id_length > 16)
      aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                         "Invalid frame_id_length");
  }

  setup_sb_size(seq_params, rb);

  seq_params->enable_filter_intra = aom_rb_read_bit(rb);
  seq_params->enable_intra_edge_filter = aom_rb_read_bit(rb);

  if (seq_params->reduced_still_picture_hdr) {
    seq_params->enable_interintra_compound = 0;
    seq_params->enable_masked_compound = 0;
    seq_params->enable_warped_motion = 0;
    seq_params->enable_dual_filter = 0;
    seq_params->order_hint_info.enable_order_hint = 0;
    seq_params->order_hint_info.enable_dist_wtd_comp = 0;
    seq_params->order_hint_info.enable_ref_frame_mvs = 0;
    seq_params->force_screen_content_tools = 2;  // SELECT_SCREEN_CONTENT_TOOLS
    seq_params->force_integer_mv = 2;            // SELECT_INTEGER_MV
    seq_params->order_hint_info.order_hint_bits_minus_1 = -1;
  } else {
    seq_params->enable_interintra_compound = aom_rb_read_bit(rb);
    seq_params->enable_masked_compound = aom_rb_read_bit(rb);
    seq_params->enable_warped_motion = aom_rb_read_bit(rb);
    seq_params->enable_dual_filter = aom_rb_read_bit(rb);

    seq_params->order_hint_info.enable_order_hint = aom_rb_read_bit(rb);
    seq_params->order_hint_info.enable_dist_wtd_comp =
        seq_params->order_hint_info.enable_order_hint ? aom_rb_read_bit(rb) : 0;
    seq_params->order_hint_info.enable_ref_frame_mvs =
        seq_params->order_hint_info.enable_order_hint ? aom_rb_read_bit(rb) : 0;

    if (aom_rb_read_bit(rb)) {
      seq_params->force_screen_content_tools =
          2;  // SELECT_SCREEN_CONTENT_TOOLS
    } else {
      seq_params->force_screen_content_tools = aom_rb_read_bit(rb);
    }

    if (seq_params->force_screen_content_tools > 0) {
      if (aom_rb_read_bit(rb)) {
        seq_params->force_integer_mv = 2;  // SELECT_INTEGER_MV
      } else {
        seq_params->force_integer_mv = aom_rb_read_bit(rb);
      }
    } else {
      seq_params->force_integer_mv = 2;  // SELECT_INTEGER_MV
    }
    seq_params->order_hint_info.order_hint_bits_minus_1 =
        seq_params->order_hint_info.enable_order_hint
            ? aom_rb_read_literal(rb, 3)
            : -1;
  }

  seq_params->enable_superres = aom_rb_read_bit(rb);
  seq_params->enable_cdef = aom_rb_read_bit(rb);
  seq_params->enable_restoration = aom_rb_read_bit(rb);
}